

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int declarator(sym_t *s)

{
  int iVar1;
  token_t *ptVar2;
  int iVar3;
  
  ptVar2 = t;
  iVar1 = t->id;
  if (iVar1 == 0x86) {
    strcpy(s->id,t->string);
    last_id = ptVar2->id;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
    if (t->id == 0x28) {
      iVar3 = 0x28;
      do {
        last_id = iVar3;
        t = get_token();
        eline = t->line;
        ecolumn = t->column;
        if (s->function == 0) {
          s->function = 1;
          iVar3 = expect(0x29);
          if (iVar3 == 0) goto LAB_00105d8d;
        }
        else {
          err(E,"\'%s\' declared as a function returning a function",s);
LAB_00105d8d:
          sync();
        }
        iVar3 = t->id;
      } while (iVar3 == 0x28);
    }
  }
  return (int)(iVar1 == 0x86);
}

Assistant:

int direct_declarator(sym_t* s)
{
    if (t->id == IDENTIFIER)
    {
        strcpy(s->id, t->string);
        next();

        while (/* t->id == '[' || */ t->id == '(' )
        {
            /* if (t->id == '[')
            {
            }
            else */ if (accept('('))
            {

                if (s->function)
                {
                    err(E, "'%s' declared as a function returning a function", s->id);
                    sync(")");
                }
                else
                {
                    s->function = 1;
                    if (expect(')'))
                        ;
                    else
                        sync(")");
                }
            }

        }

        return 1;
    }
    /*
    else if (t->id == '(')
    {
        declarator etc
        if (t->id == '['
    }

    */
    return 0;
}